

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::SSBOLayoutCase::checkLayoutIndices(SSBOLayoutCase *this,BufferLayout *layout)

{
  bool bVar1;
  deBool dVar2;
  size_type sVar3;
  MessageBuilder *pMVar4;
  reference piVar5;
  MessageBuilder local_360;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1e0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1d8;
  const_iterator varNdxIter;
  BlockLayoutEntry *block;
  int blockNdx;
  MessageBuilder local_1b8;
  const_reference local_38;
  BufferVarLayoutEntry *bufVar;
  int varNdx;
  int iStack_24;
  bool isOk;
  int numBlocks;
  int numVars;
  TestLog *log;
  BufferLayout *layout_local;
  SSBOLayoutCase *this_local;
  
  log = (TestLog *)layout;
  layout_local = (BufferLayout *)this;
  _numBlocks = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  sVar3 = std::
          vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
          ::size((vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                  *)(log + 3));
  iStack_24 = (int)sVar3;
  sVar3 = std::
          vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
          ::size((vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                  *)log);
  varNdx = (int)sVar3;
  bufVar._7_1_ = 1;
  bufVar._0_4_ = 0;
  do {
    if (iStack_24 <= (int)bufVar) {
      for (block._0_4_ = 0; (int)block < varNdx; block._0_4_ = (int)block + 1) {
        varNdxIter._M_current =
             (int *)std::
                    vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                    ::operator[]((vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                                  *)log,(long)(int)block);
        local_1d8._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              (&((const_reference)varNdxIter._M_current)->activeVarIndices);
        while( true ) {
          local_1e0._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)(varNdxIter._M_current + 10));
          bVar1 = __gnu_cxx::operator!=(&local_1d8,&local_1e0);
          if (!bVar1) break;
          piVar5 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_1d8);
          dVar2 = deInBounds32(*piVar5,0,iStack_24);
          if (dVar2 == 0) {
            tcu::TestLog::operator<<
                      (&local_360,_numBlocks,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar4 = tcu::MessageBuilder::operator<<
                               (&local_360,(char (*) [38])"Error: Invalid active variable index ");
            piVar5 = __gnu_cxx::
                     __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_1d8);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,piVar5);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [12])0x2c49d43);
            pMVar4 = tcu::MessageBuilder::operator<<
                               (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)varNdxIter._M_current);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b52210);
            tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_360);
            bufVar._7_1_ = 0;
          }
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&local_1d8,0);
        }
      }
      return (bool)(bufVar._7_1_ & 1);
    }
    local_38 = std::
               vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
               ::operator[]((vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                             *)(log + 3),(long)(int)bufVar);
    if (local_38->blockNdx < 0) {
LAB_023f22d0:
      tcu::TestLog::operator<<(&local_1b8,_numBlocks,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_1b8,
                          (char (*) [48])"Error: Invalid block index in buffer variable \'");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_38->name);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b52210);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b8);
      bufVar._7_1_ = 0;
    }
    else {
      dVar2 = deInBounds32(local_38->blockNdx,0,varNdx);
      if (dVar2 == 0) goto LAB_023f22d0;
    }
    bufVar._0_4_ = (int)bufVar + 1;
  } while( true );
}

Assistant:

bool SSBOLayoutCase::checkLayoutIndices (const BufferLayout& layout) const
{
	TestLog&	log			= m_testCtx.getLog();
	int			numVars		= (int)layout.bufferVars.size();
	int			numBlocks	= (int)layout.blocks.size();
	bool		isOk		= true;

	// Check variable block indices.
	for (int varNdx = 0; varNdx < numVars; varNdx++)
	{
		const BufferVarLayoutEntry& bufVar = layout.bufferVars[varNdx];

		if (bufVar.blockNdx < 0 || !deInBounds32(bufVar.blockNdx, 0, numBlocks))
		{
			log << TestLog::Message << "Error: Invalid block index in buffer variable '" << bufVar.name << "'" << TestLog::EndMessage;
			isOk = false;
		}
	}

	// Check active variables.
	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const BlockLayoutEntry& block = layout.blocks[blockNdx];

		for (vector<int>::const_iterator varNdxIter = block.activeVarIndices.begin(); varNdxIter != block.activeVarIndices.end(); varNdxIter++)
		{
			if (!deInBounds32(*varNdxIter, 0, numVars))
			{
				log << TestLog::Message << "Error: Invalid active variable index " << *varNdxIter << " in block '" << block.name << "'" << TestLog::EndMessage;
				isOk = false;
			}
		}
	}

	return isOk;
}